

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ImmediatePromiseNode<unsigned_int>::ImmediatePromiseNode
          (ImmediatePromiseNode<unsigned_int> *this,ExceptionOr<unsigned_int> *result)

{
  ImmediatePromiseNodeBase::ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_0041d658;
  ExceptionOr<unsigned_int>::ExceptionOr(&this->result,result);
  return;
}

Assistant:

ImmediatePromiseNode(ExceptionOr<T>&& result): result(kj::mv(result)) {}